

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O3

void dumpPubSection(DWARFContext *DCtx,PubSection *Y,DWARFSection Section)

{
  pointer *ppPVar1;
  DWARFObject *pDVar2;
  iterator __position;
  Hex8 HVar3;
  uint16_t uVar4;
  int iVar5;
  uint32_t uVar6;
  char *__s;
  ulong uVar7;
  undefined1 local_90 [8];
  DWARFDataExtractor PubSectionData;
  DWARFSection Section_local;
  PubEntry local_50;
  uint64_t local_38;
  uint64_t Offset;
  
  pDVar2 = (DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  PubSectionData.Section = (DWARFSection *)Section.Data.Data;
  iVar5 = (*pDVar2->_vptr_DWARFObject[5])(pDVar2);
  PubSectionData.super_DataExtractor.Data.Length._0_1_ = (undefined1)iVar5;
  PubSectionData.super_DataExtractor.Data.Length._1_1_ = 0;
  PubSectionData.Obj = (DWARFObject *)&PubSectionData.Section;
  local_38 = 0;
  local_90 = (undefined1  [8])Section.Data.Data;
  PubSectionData.super_DataExtractor.Data.Data = (char *)Section.Data.Length;
  PubSectionData.super_DataExtractor._16_8_ = pDVar2;
  dumpInitialLength((DataExtractor *)local_90,&local_38,&Y->Length);
  uVar4 = llvm::DataExtractor::getU16((DataExtractor *)local_90,&local_38,(Error *)0x0);
  Y->Version = uVar4;
  uVar6 = llvm::DataExtractor::getU32((DataExtractor *)local_90,&local_38,(Error *)0x0);
  Y->UnitOffset = uVar6;
  uVar6 = llvm::DataExtractor::getU32((DataExtractor *)local_90,&local_38,(Error *)0x0);
  Y->UnitSize = uVar6;
  uVar7 = (ulong)(Y->Length).TotalLength;
  if (uVar7 == 0xffffffff) {
    uVar7 = (Y->Length).TotalLength64;
  }
  if (local_38 < uVar7) {
    do {
      local_50.Name.Data = (char *)0x0;
      local_50.Name.Length = 0;
      local_50.DieOffset.value =
           llvm::DataExtractor::getU32((DataExtractor *)local_90,&local_38,(Error *)0x0);
      if (Y->IsGNUStyle == true) {
        HVar3.value = llvm::DataExtractor::getU8((DataExtractor *)local_90,&local_38,(Error *)0x0);
        local_50.Descriptor.value = HVar3.value;
      }
      __s = llvm::DataExtractor::getCStr((DataExtractor *)local_90,&local_38);
      if (__s == (char *)0x0) {
        local_50.Name.Length = 0;
      }
      else {
        local_50.Name.Length = strlen(__s);
      }
      __position._M_current =
           (Y->Entries).
           super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (Y->Entries).
          super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_50.Name.Data = __s;
        std::vector<llvm::DWARFYAML::PubEntry,std::allocator<llvm::DWARFYAML::PubEntry>>::
        _M_realloc_insert<llvm::DWARFYAML::PubEntry_const&>
                  ((vector<llvm::DWARFYAML::PubEntry,std::allocator<llvm::DWARFYAML::PubEntry>> *)
                   &Y->Entries,__position,&local_50);
      }
      else {
        ((__position._M_current)->Name).Length = local_50.Name.Length;
        (__position._M_current)->DieOffset = (Hex32)local_50.DieOffset.value;
        (__position._M_current)->Descriptor = (Hex8)local_50.Descriptor.value;
        *(int3 *)&(__position._M_current)->field_0x5 = local_50._5_3_;
        ((__position._M_current)->Name).Data = __s;
        ppPVar1 = &(Y->Entries).
                   super__Vector_base<llvm::DWARFYAML::PubEntry,_std::allocator<llvm::DWARFYAML::PubEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar1 = *ppPVar1 + 1;
      }
      uVar7 = (ulong)(Y->Length).TotalLength;
      if (uVar7 == 0xffffffff) {
        uVar7 = (Y->Length).TotalLength64;
      }
    } while (local_38 < uVar7);
  }
  return;
}

Assistant:

void dumpPubSection(DWARFContext &DCtx, DWARFYAML::PubSection &Y,
                    DWARFSection Section) {
  DWARFDataExtractor PubSectionData(DCtx.getDWARFObj(), Section,
                                    DCtx.isLittleEndian(), 0);
  uint64_t Offset = 0;
  dumpInitialLength(PubSectionData, Offset, Y.Length);
  Y.Version = PubSectionData.getU16(&Offset);
  Y.UnitOffset = PubSectionData.getU32(&Offset);
  Y.UnitSize = PubSectionData.getU32(&Offset);
  while (Offset < Y.Length.getLength()) {
    DWARFYAML::PubEntry NewEntry;
    NewEntry.DieOffset = PubSectionData.getU32(&Offset);
    if (Y.IsGNUStyle)
      NewEntry.Descriptor = PubSectionData.getU8(&Offset);
    NewEntry.Name = PubSectionData.getCStr(&Offset);
    Y.Entries.push_back(NewEntry);
  }
}